

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTVariableExpression.cpp
# Opt level: O0

void __thiscall
MathML::AST::VariableExpression::VariableExpression(VariableExpression *this,String *name)

{
  string *in_RSI;
  INode *in_RDI;
  
  INode::INode(in_RDI);
  in_RDI->_vptr_INode = (_func_int **)&PTR__VariableExpression_00e6db50;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  in_RDI[5]._vptr_INode = (_func_int **)0x0;
  return;
}

Assistant:

VariableExpression::VariableExpression( const String& name )
                : mName( name )
                , mValue( 0 )
        {}